

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

uint32_t vkb::detail::get_separate_queue_index
                   (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    *families,VkQueueFlags desired_flags,VkQueueFlags undesired_flags)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pVVar5;
  
  pVVar5 = (families->
           super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(families->
                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5;
  uVar3 = 0xffffffffffffffff;
  uVar4 = 0;
  do {
    if ((lVar2 / 0x18 & 0xffffffffU) <= uVar4) {
      return (uint32_t)uVar3;
    }
    uVar1 = pVVar5->queueFlags;
    if ((uVar1 & 1) == 0 && (desired_flags & ~uVar1) == 0) {
      if ((uVar1 & undesired_flags) == 0) {
        return (uint32_t)uVar4;
      }
      uVar3 = uVar4 & 0xffffffff;
    }
    uVar4 = uVar4 + 1;
    pVVar5 = pVVar5 + 1;
  } while( true );
}

Assistant:

uint32_t get_separate_queue_index(
    std::vector<VkQueueFamilyProperties> const& families, VkQueueFlags desired_flags, VkQueueFlags undesired_flags) {
    uint32_t index = QUEUE_INDEX_MAX_VALUE;
    for (uint32_t i = 0; i < static_cast<uint32_t>(families.size()); i++) {
        if ((families[i].queueFlags & desired_flags) == desired_flags && ((families[i].queueFlags & VK_QUEUE_GRAPHICS_BIT) == 0)) {
            if ((families[i].queueFlags & undesired_flags) == 0) {
                return i;
            } else {
                index = i;
            }
        }
    }
    return index;
}